

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

bool __thiscall DnsStats::IsNumericDomain(DnsStats *this,uint8_t *tld,uint32_t length)

{
  uint8_t *puVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  
  bVar4 = length == 0;
  if ((!bVar4) && (0xf5 < (byte)(*tld - 0x3a))) {
    lVar3 = 1;
    do {
      uVar2 = (uint)lVar3;
      if (length == uVar2) break;
      puVar1 = tld + lVar3;
      lVar3 = lVar3 + 1;
    } while (0xf5 < (byte)(*puVar1 - 0x3a));
    bVar4 = length <= uVar2;
  }
  return bVar4;
}

Assistant:

bool DnsStats::IsNumericDomain(uint8_t * tld, uint32_t length)
{
    bool ret = true;

    for (uint32_t i = 0; i < length; i++)
    {
        if (tld[i] < '0' || tld[i] > '9')
        {
            ret = false;
            break;
        }
    }

    return ret;
}